

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O2

CImg<unsigned_char> * __thiscall
cimg_library::CImg<unsigned_char>::resize
          (CImg<unsigned_char> *this,int size_x,int size_y,int size_z,int size_c,
          int interpolation_type,uint boundary_conditions,float centering_x,float centering_y,
          float centering_z,float centering_c)

{
  bool bVar1;
  CImg<unsigned_char> *pCVar2;
  uint size_c_00;
  uint size_y_00;
  uint size_x_00;
  uint size_z_00;
  CImg<unsigned_char> local_50;
  
  if ((size_z != 0 && (size_y != 0 && size_x != 0)) && size_c != 0) {
    if (size_x < 0) {
      size_x = (int)-(size_x * this->_width) / 100;
    }
    if (size_y < 0) {
      size_y = (int)-(size_y * this->_height) / 100;
    }
    if (size_z < 0) {
      size_z = (int)-(size_z * this->_depth) / 100;
    }
    if (size_c < 0) {
      size_c = (int)-(size_c * this->_spectrum) / 100;
    }
    size_x_00 = size_x + (uint)(size_x == 0);
    size_y_00 = size_y + (uint)(size_y == 0);
    size_z_00 = size_z + (uint)(size_z == 0);
    size_c_00 = size_c + (uint)(size_c == 0);
    if ((((size_x_00 != this->_width) || (size_y_00 != this->_height)) ||
        (size_z_00 != this->_depth)) || (size_c_00 != this->_spectrum)) {
      bVar1 = is_empty(this);
      if (bVar1) {
        local_50._width._0_1_ = 0;
        this = assign(this,size_x_00,size_y_00,size_z_00,size_c_00,(uchar *)&local_50);
      }
      else if ((interpolation_type == -1) &&
              ((ulong)this->_spectrum * (ulong)this->_depth *
               (ulong)this->_height * (ulong)this->_width -
               (ulong)(size_z_00 * size_c_00 * size_y_00 * size_x_00) == 0)) {
        this->_width = size_x_00;
        this->_height = size_y_00;
        this->_depth = size_z_00;
        this->_spectrum = size_c_00;
      }
      else {
        get_resize(&local_50,this,size_x_00,size_y_00,size_z_00,size_c_00,interpolation_type,
                   boundary_conditions,centering_x,centering_y,centering_z,centering_c);
        this = move_to(&local_50,this);
        ~CImg(&local_50);
      }
    }
    return this;
  }
  pCVar2 = assign(this);
  return pCVar2;
}

Assistant:

CImg<T>& resize(const int size_x, const int size_y=-100,
                    const int size_z=-100, const int size_c=-100,
                    const int interpolation_type=1, const unsigned int boundary_conditions=0,
                    const float centering_x = 0, const float centering_y = 0,
                    const float centering_z = 0, const float centering_c = 0) {
      if (!size_x || !size_y || !size_z || !size_c) return assign();
      const unsigned int
        _sx = (unsigned int)(size_x<0?-size_x*width()/100:size_x),
        _sy = (unsigned int)(size_y<0?-size_y*height()/100:size_y),
        _sz = (unsigned int)(size_z<0?-size_z*depth()/100:size_z),
        _sc = (unsigned int)(size_c<0?-size_c*spectrum()/100:size_c),
        sx = _sx?_sx:1, sy = _sy?_sy:1, sz = _sz?_sz:1, sc = _sc?_sc:1;
      if (sx==_width && sy==_height && sz==_depth && sc==_spectrum) return *this;
      if (is_empty()) return assign(sx,sy,sz,sc,(T)0);
      if (interpolation_type==-1 && sx*sy*sz*sc==size()) {
	_width = sx; _height = sy; _depth = sz; _spectrum = sc;
	return *this;
      }
      return get_resize(sx,sy,sz,sc,interpolation_type,boundary_conditions,
                        centering_x,centering_y,centering_z,centering_c).move_to(*this);
    }